

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessSamplersTests.cpp
# Opt level: O1

bool __thiscall
gl4cts::DirectStateAccess::Samplers::DefaultsTest::testSamplerIntegerParameter
          (DefaultsTest *this,GLenum pname,GLint expected_value)

{
  int iVar1;
  deUint32 err;
  undefined4 extraout_var;
  char *pcVar2;
  size_t sVar3;
  GLint value;
  int local_1ac;
  undefined1 local_1a8 [8];
  _func_int **local_1a0;
  ios_base local_130 [264];
  
  iVar1 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  local_1ac = -1;
  (**(code **)(CONCAT44(extraout_var,iVar1) + 0xa50))(this->m_sampler_dsa,pname,&local_1ac);
  err = (**(code **)(CONCAT44(extraout_var,iVar1) + 0x800))();
  glu::checkError(err,"glGetSamplerParameteriv have failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessSamplersTests.cpp"
                  ,0x107);
  if (local_1ac == -1) {
    local_1a8 = (undefined1  [8])((this->super_TestCase).m_context)->m_testCtx->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a0,"glGetSamplerParameteriv with parameter ",0x27);
    pcVar2 = glu::getTextureParameterName(pname);
    if (pcVar2 == (char *)0x0) {
      std::ios::clear((int)(ostringstream *)&local_1a0 + (int)local_1a0[-3]);
    }
    else {
      sVar3 = strlen(pcVar2);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,pcVar2,sVar3);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a0," has not returned anything and error has not been generated.",
               0x3c);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  else {
    if (local_1ac == expected_value) {
      return true;
    }
    local_1a8 = (undefined1  [8])((this->super_TestCase).m_context)->m_testCtx->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a0,"glGetSamplerParameteriv with parameter ",0x27);
    pcVar2 = glu::getTextureParameterName(pname);
    if (pcVar2 == (char *)0x0) {
      std::ios::clear((int)(ostringstream *)&local_1a0 + (int)local_1a0[-3]);
    }
    else {
      sVar3 = strlen(pcVar2);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,pcVar2,sVar3);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0," has returned ",0xe);
    std::ostream::operator<<((ostringstream *)&local_1a0,local_1ac);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,", however ",10);
    std::ostream::operator<<((ostringstream *)&local_1a0,expected_value);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0," was expected.",0xe);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a0);
  std::ios_base::~ios_base(local_130);
  return false;
}

Assistant:

bool DefaultsTest::testSamplerIntegerParameter(glw::GLenum pname, glw::GLint expected_value)
{
	/* Shortcut for GL functionality */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Get data. */
	glw::GLint value = -1;

	gl.getSamplerParameteriv(m_sampler_dsa, pname, &value);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetSamplerParameteriv have failed");

	if (-1 == value)
	{
		m_context.getTestContext().getLog()
			<< tcu::TestLog::Message << "glGetSamplerParameteriv with parameter " << glu::getTextureParameterName(pname)
			<< " has not returned anything and error has not been generated." << tcu::TestLog::EndMessage;

		return false;
	}
	else
	{
		if (expected_value != value)
		{
			m_context.getTestContext().getLog() << tcu::TestLog::Message << "glGetSamplerParameteriv with parameter "
												<< glu::getTextureParameterName(pname) << " has returned " << value
												<< ", however " << expected_value << " was expected."
												<< tcu::TestLog::EndMessage;

			return false;
		}
	}

	return true;
}